

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkPointFrame.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChLinkPointFrameGeneric::IntLoadConstraint_C
          (ChLinkPointFrameGeneric *this,uint off_L,ChVectorDynamic<> *Qc,double c,bool do_clamp,
          double recovery_clamp)

{
  undefined1 auVar1 [32];
  element_type *peVar2;
  element_type *peVar3;
  double *pdVar4;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  int iVar12;
  ulong uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [32];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  double dVar21;
  undefined8 in_XMM1_Qb;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  ChQuaternion<double> q;
  ChMatrix33<double> Arw;
  ChQuaternion<double> local_98;
  undefined1 local_78 [24];
  double local_60;
  double local_58;
  double dStack_50;
  double local_48;
  undefined1 local_40 [16];
  
  uVar13 = (ulong)off_L;
  iVar12 = (*(this->super_ChLinkBase).super_ChPhysicsItem.super_ChObj._vptr_ChObj[9])();
  if ((char)iVar12 != '\0') {
    peVar2 = (this->m_body).super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    auVar1 = *(undefined1 (*) [32])(this->m_csys).rot.m_data;
    dVar21 = (this->m_csys).rot.m_data[1];
    auVar33._24_8_ = dVar21;
    auVar33._16_8_ = dVar21;
    dVar21 = (peVar2->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[1];
    auVar16._8_8_ = 0;
    auVar16._0_8_ = dVar21;
    auVar14 = *(undefined1 (*) [16])
               ((peVar2->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data + 2);
    auVar8 = vpermpd_avx2(auVar1,1);
    auVar9 = vpermpd_avx2(ZEXT1632(*(undefined1 (*) [16])((this->m_csys).rot.m_data + 2)),0x15);
    auVar26._0_8_ = -dVar21;
    auVar26._8_8_ = 0x8000000000000000;
    auVar22._0_8_ = -auVar14._0_8_;
    auVar22._8_8_ = -auVar14._8_8_;
    auVar7 = vunpcklpd_avx(auVar26,auVar16);
    auVar20._16_16_ = auVar14;
    auVar20._0_16_ = auVar7;
    auVar15._0_8_ = auVar8._0_8_ * auVar7._0_8_;
    auVar15._8_8_ = auVar8._8_8_ * auVar7._8_8_;
    auVar15._16_8_ = auVar8._16_8_ * auVar14._0_8_;
    auVar15._24_8_ = auVar8._24_8_ * auVar14._8_8_;
    dVar21 = (peVar2->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[0];
    auVar8._8_8_ = dVar21;
    auVar8._0_8_ = dVar21;
    auVar8._16_8_ = dVar21;
    auVar8._24_8_ = dVar21;
    auVar15 = vfmadd231pd_avx512vl(auVar15,auVar1,auVar8);
    dVar21 = (peVar2->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[3];
    auVar32._24_8_ = dVar21;
    auVar32._16_8_ = dVar21;
    dVar21 = (this->m_csys).rot.m_data[2];
    auVar33._8_8_ = dVar21;
    auVar33._0_8_ = dVar21;
    auVar1 = vpermpd_avx2(auVar20,0x66);
    auVar32._0_16_ = auVar22;
    auVar25._16_16_ = auVar26;
    auVar25._0_16_ = auVar22;
    auVar1 = vshufpd_avx(auVar25,auVar1,9);
    auVar8 = vpermpd_avx2(auVar32,0x24);
    auVar14 = vfmadd213pd_fma(auVar33,auVar8,auVar15);
    auVar14 = vfmadd213pd_fma(auVar1,auVar9,ZEXT1632(auVar14));
    local_98.m_data = (double  [4])ZEXT1632(auVar14);
    ChMatrix33<double>::ChMatrix33((ChMatrix33<double> *)local_78,&local_98);
    peVar2 = (this->m_body).super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    peVar3 = (this->m_node).
             super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    ChTransform<double>::TransformLocalToParent
              (&(this->m_csys).pos,
               &(peVar2->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos,
               &(peVar2->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix);
    dVar21 = *(double *)&peVar3->field_0x28 - local_98.m_data[1];
    dVar5 = *(double *)&(peVar3->super_ChNodeFEAbase).field_0x20 - local_98.m_data[0];
    dVar6 = *(double *)&peVar3->field_0x30 - local_98.m_data[2];
    auVar14._8_8_ = 0;
    auVar14._0_8_ = local_78._0_8_;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = dVar5;
    auVar30._8_8_ = 0;
    auVar30._0_8_ = dVar21 * local_60;
    auVar14 = vfmadd231sd_fma(auVar30,auVar17,auVar14);
    auVar23._0_8_ = dVar21 * local_58;
    auVar23._8_8_ = dVar21 * dStack_50;
    auVar18._8_8_ = dVar5;
    auVar18._0_8_ = dVar5;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = local_48;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = dVar6;
    auVar7 = vfmadd231sd_fma(auVar14,auVar27,auVar7);
    auVar28._8_8_ = dVar6;
    auVar28._0_8_ = dVar6;
    auVar14 = vfmadd132pd_fma(auVar18,auVar23,local_78._8_16_);
    auVar14 = vfmadd132pd_fma(auVar28,auVar14,local_40);
    dVar21 = auVar7._0_8_ * c;
    auVar19._0_8_ = auVar14._0_8_ * c;
    auVar19._8_8_ = auVar14._8_8_ * c;
    if (do_clamp) {
      auVar11._8_8_ = in_XMM1_Qb;
      auVar11._0_8_ = recovery_clamp;
      auVar29._8_8_ = recovery_clamp;
      auVar29._0_8_ = recovery_clamp;
      auVar10._8_8_ = 0x8000000000000000;
      auVar10._0_8_ = 0x8000000000000000;
      auVar14 = vxorpd_avx512vl(auVar29,auVar10);
      auVar24._8_8_ = 0;
      auVar24._0_8_ = dVar21;
      auVar7 = vmaxsd_avx(auVar24,auVar14);
      auVar31._0_8_ = auVar14._0_8_;
      auVar31._8_8_ = auVar31._0_8_;
      auVar14 = vmaxpd_avx(auVar19,auVar31);
      auVar7 = vminsd_avx(auVar7,auVar11);
      dVar21 = auVar7._0_8_;
      auVar19 = vminpd_avx(auVar14,auVar29);
    }
    iVar12 = 0;
    if ((this->c_x == true) &&
       (iVar12 = 0, (this->constraint1).super_ChConstraintTwo.super_ChConstraint.active == true)) {
      if ((Qc->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <=
          (long)uVar13) goto LAB_0061a8cb;
      pdVar4 = (Qc->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
      ;
      pdVar4[uVar13] = dVar21 + pdVar4[uVar13];
      iVar12 = 1;
    }
    if ((this->c_y == true) &&
       ((this->constraint2).super_ChConstraintTwo.super_ChConstraint.active == true)) {
      uVar13 = (ulong)(iVar12 + off_L);
      if ((Qc->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <=
          (long)uVar13) goto LAB_0061a8cb;
      pdVar4 = (Qc->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
      ;
      iVar12 = iVar12 + 1;
      pdVar4[uVar13] = auVar19._0_8_ + pdVar4[uVar13];
    }
    if ((this->c_z == true) &&
       ((this->constraint3).super_ChConstraintTwo.super_ChConstraint.active == true)) {
      uVar13 = (ulong)(iVar12 + off_L);
      if ((Qc->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <=
          (long)uVar13) {
LAB_0061a8cb:
        __assert_fail("index >= 0 && index < size()",
                      "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                     );
      }
      pdVar4 = (Qc->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
      ;
      auVar14 = vshufpd_avx(auVar19,auVar19,1);
      pdVar4[uVar13] = auVar14._0_8_ + pdVar4[uVar13];
    }
  }
  return;
}

Assistant:

void ChLinkPointFrameGeneric::IntLoadConstraint_C(const unsigned int off_L,  // offset in Qc residual
                                                  ChVectorDynamic<>& Qc,     // result: the Qc residual, Qc += c*C
                                                  const double c,            // a scaling factor
                                                  bool do_clamp,             // apply clamping to c*C?
                                                  double recovery_clamp      // value for min/max clamping of c*C
) {
    if (!IsActive())
        return;

    ChMatrix33<> Arw(m_csys.rot >> m_body->GetRot());

    ChVector<> res = Arw.transpose() * (m_node->GetPos() - m_body->TransformPointLocalToParent(m_csys.pos));
    ChVector<> cres = res * c;

    if (do_clamp) {
        cres.x() = ChMin(ChMax(cres.x(), -recovery_clamp), recovery_clamp);
        cres.y() = ChMin(ChMax(cres.y(), -recovery_clamp), recovery_clamp);
        cres.z() = ChMin(ChMax(cres.z(), -recovery_clamp), recovery_clamp);
    }

    int cnt = 0;
    if (c_x && this->constraint1.IsActive()) {
        Qc(off_L + cnt) += cres.x();
        cnt++;
    }
    if (c_y && this->constraint2.IsActive()) {
        Qc(off_L + cnt) += cres.y();
        cnt++;
    }
    if (c_z && this->constraint3.IsActive()) {
        Qc(off_L + cnt) += cres.z();
        // cnt++;
    }
}